

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,REF_INT id)

{
  double dVar1;
  REF_GRID pRVar2;
  REF_AGENTS ref_agents;
  REF_AGENT_STRUCT *pRVar3;
  uint uVar4;
  REF_AGENT_STRUCT *pRVar5;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  uint unaff_EBP;
  ulong uVar9;
  char *pcVar10;
  REF_DBL bary [4];
  REF_INT nodes [27];
  double local_d8 [5];
  REF_NODE local_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_CELL local_38;
  
  pRVar2 = ref_interp->from_grid;
  ref_agents = ref_interp->ref_agents;
  pRVar5 = ref_agents->agent + id;
  if (ref_agents->agent[id].step < 0xd7) {
    local_b0 = pRVar2->node;
    local_38 = (&ref_interp->from_tet)[pRVar2->twod != 0];
    do {
      if (pRVar5->mode != REF_AGENT_WALKING) {
        return 0;
      }
      uVar4 = ref_cell_nodes(local_38,pRVar5->seed,&local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x2a2,"ref_interp_walk_agent",(ulong)uVar4,"cell");
        ref_agents_tattle(ref_agents,id,"cell_nodes in walk");
        return uVar4;
      }
      if (pRVar2->twod == 0) {
        uVar4 = ref_node_bary4(local_b0,&local_a8,ref_agents->agent[id].xyz,local_d8);
        if ((uVar4 & 0xfffffffb) != 0) {
          uVar8 = 0x2ac;
          goto LAB_001777b5;
        }
      }
      else {
        local_d8[3] = 0.0;
        uVar4 = ref_node_bary3(local_b0,&local_a8,ref_agents->agent[id].xyz,local_d8);
        if ((uVar4 & 0xfffffffb) != 0) {
          uVar8 = 0x2a8;
LAB_001777b5:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar8,"ref_interp_walk_agent",(ulong)uVar4,"bary");
          unaff_EBP = uVar4;
        }
      }
      if ((uVar4 & 0xfffffffb) != 0) {
        return unaff_EBP;
      }
      if (0xd7 < ref_agents->agent[id].step) {
        printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n",local_d8[0],local_d8[1],local_d8[2],
               local_d8[3],ref_interp->inside);
        uVar4 = ref_agents_tattle(ref_agents,id,"many steps");
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x2b3,"ref_interp_walk_agent",(ulong)uVar4,"tat");
          return uVar4;
        }
      }
      dVar1 = ref_interp->inside;
      if ((((dVar1 <= local_d8[0]) && (dVar1 <= local_d8[1])) && (dVar1 <= local_d8[2])) &&
         (dVar1 <= local_d8[3])) {
        pRVar5 = ref_agents->agent;
        pRVar5[id].mode = REF_AGENT_ENCLOSING;
        lVar6 = 0;
        do {
          pRVar5[id].bary[lVar6] = local_d8[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        return 0;
      }
      if (pRVar2->twod == 0) {
        if ((local_d8[1] <= local_d8[0] || local_d8[2] <= local_d8[0]) || local_d8[3] <= local_d8[0]
           ) {
          if (((local_d8[0] <= local_d8[1]) || (local_d8[3] <= local_d8[1])) ||
             (local_d8[2] <= local_d8[1])) {
            if (((local_d8[0] <= local_d8[2]) || (local_d8[1] <= local_d8[2])) ||
               (local_d8[3] <= local_d8[2])) {
              if (((local_d8[0] <= local_d8[3]) || (local_d8[2] <= local_d8[3])) ||
                 (local_d8[1] <= local_d8[3])) {
                if (((local_d8[1] < local_d8[0]) || (local_d8[2] < local_d8[0])) ||
                   (local_d8[3] < local_d8[0])) {
                  if (((local_d8[0] < local_d8[1]) || (local_d8[3] < local_d8[1])) ||
                     (local_d8[2] < local_d8[1])) {
                    if (((local_d8[0] < local_d8[2]) || (local_d8[1] < local_d8[2])) ||
                       (local_d8[3] < local_d8[2])) {
                      if (((local_d8[0] < local_d8[3]) || (local_d8[2] < local_d8[3])) ||
                         (local_d8[1] < local_d8[3])) goto LAB_00177df9;
                      uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a0,local_a4);
                      if (uVar4 != 0) {
                        uVar8 = 0x314;
                        goto LAB_00177b96;
                      }
                    }
                    else {
                      uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a4,local_9c);
                      if (uVar4 != 0) {
                        uVar8 = 0x30d;
                        goto LAB_00177ae4;
                      }
                    }
                  }
                  else {
                    uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_9c,local_a0);
                    if (uVar4 != 0) {
                      uVar8 = 0x306;
                      goto LAB_00177a27;
                    }
                  }
                }
                else {
                  uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a4,local_a0,local_9c);
                  if (uVar4 != 0) {
                    uVar8 = 0x2ff;
                    goto LAB_00177960;
                  }
                }
              }
              else {
                uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a0,local_a4);
                if (uVar4 != 0) {
                  uVar8 = 0x2f7;
LAB_00177b96:
                  uVar9 = (ulong)uVar4;
                  pcVar10 = "0 2 1";
                  goto LAB_00177ba7;
                }
              }
            }
            else {
              uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a4,local_9c);
              if (uVar4 != 0) {
                uVar8 = 0x2f0;
LAB_00177ae4:
                uVar9 = (ulong)uVar4;
                pcVar10 = "0 1 3";
                goto LAB_00177ba7;
              }
            }
          }
          else {
            uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_9c,local_a0);
            if (uVar4 != 0) {
              uVar8 = 0x2e9;
LAB_00177a27:
              uVar9 = (ulong)uVar4;
              pcVar10 = "0 3 2";
              goto LAB_00177ba7;
            }
          }
        }
        else {
          uVar4 = ref_update_agent_tet_seed(ref_interp,id,local_a4,local_a0,local_9c);
          if (uVar4 != 0) {
            uVar8 = 0x2e2;
LAB_00177960:
            uVar9 = (ulong)uVar4;
            pcVar10 = "1 2 3";
            goto LAB_00177ba7;
          }
        }
      }
      else if (local_d8[1] <= local_d8[0] || local_d8[2] <= local_d8[0]) {
        if ((local_d8[0] <= local_d8[1]) || (local_d8[2] <= local_d8[1])) {
          if (local_d8[0] <= local_d8[2]) {
            if ((local_d8[1] < local_d8[0]) || (local_d8[2] < local_d8[0])) {
              if ((local_d8[0] < local_d8[1]) || (local_d8[2] < local_d8[1])) {
                if (local_d8[0] < local_d8[2]) {
LAB_00177df9:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x318,"ref_interp_walk_agent","unable to find the next step");
                  return 1;
                }
                uVar4 = ref_update_agent_tri_seed(ref_interp,id,local_a8,local_a4);
                if (uVar4 != 0) {
                  uVar8 = 0x2da;
                  goto LAB_00177a79;
                }
              }
              else {
                uVar4 = ref_update_agent_tri_seed(ref_interp,id,local_a0,local_a8);
                if (uVar4 != 0) {
                  uVar8 = 0x2d5;
                  goto LAB_001779bc;
                }
              }
            }
            else {
              uVar4 = ref_update_agent_tri_seed(ref_interp,id,local_a4,local_a0);
              if (uVar4 != 0) {
                uVar8 = 0x2d0;
                goto LAB_00177902;
              }
            }
          }
          else {
            uVar4 = ref_update_agent_tri_seed(ref_interp,id,local_a8,local_a4);
            if (uVar4 != 0) {
              uVar8 = 0x2ca;
LAB_00177a79:
              uVar9 = (ulong)uVar4;
              pcVar10 = "0 1";
              goto LAB_00177ba7;
            }
          }
        }
        else {
          uVar4 = ref_update_agent_tri_seed(ref_interp,id,local_a0,local_a8);
          if (uVar4 != 0) {
            uVar8 = 0x2c5;
LAB_001779bc:
            uVar9 = (ulong)uVar4;
            pcVar10 = "2 0";
            goto LAB_00177ba7;
          }
        }
      }
      else {
        uVar4 = ref_update_agent_tri_seed(ref_interp,id,local_a4,local_a0);
        if (uVar4 != 0) {
          uVar8 = 0x2c0;
LAB_00177902:
          uVar9 = (ulong)uVar4;
          pcVar10 = "1 2";
LAB_00177ba7:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar8,"ref_interp_walk_agent",uVar9,pcVar10);
          unaff_EBP = uVar4;
        }
      }
      if (uVar4 != 0) {
        return unaff_EBP;
      }
      pRVar3 = ref_agents->agent;
      pRVar5 = pRVar3 + id;
      iVar7 = pRVar3[id].step + 1;
      pRVar3[id].step = iVar7;
    } while (iVar7 < 0xd7);
  }
  pRVar5->mode = REF_AGENT_TERMINATED;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,
                                                REF_INT id) {
  REF_GRID ref_grid = ref_interp_from_grid(ref_interp);
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, limit;
  REF_DBL bary[4];
  REF_AGENTS ref_agents = ref_interp->ref_agents;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_interp_from_tri(ref_interp);
  } else {
    ref_cell = ref_interp_from_tet(ref_interp);
  }

  limit = 215; /* 10e6^(1/3), required 108 for twod testcase  */

  each_ref_agent_step(ref_agents, id, limit) {
    /* return if no longer walking */
    if (REF_AGENT_WALKING != ref_agent_mode(ref_agents, id)) {
      return REF_SUCCESS;
    }

    RSB(ref_cell_nodes(ref_cell, ref_agent_seed(ref_agents, id), nodes), "cell",
        { ref_agents_tattle(ref_agents, id, "cell_nodes in walk"); });
    /* when REF_DIV_ZERO, min bary is preserved */
    if (ref_grid_twod(ref_grid)) {
      bary[3] = 0.0;
      RXS(ref_node_bary3(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    } else {
      RXS(ref_node_bary4(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    }

    if (ref_agent_step(ref_agents, id) > (limit)) {
      printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n", bary[0], bary[1],
             bary[2], bary[3], ref_interp->inside,
             ref_agent_step(ref_agents, id));
      RSS(ref_agents_tattle(ref_agents, id, "many steps"), "tat");
    }

    if (ref_interp_bary_inside(ref_interp, bary)) {
      ref_agent_mode(ref_agents, id) = REF_AGENT_ENCLOSING;
      for (i = 0; i < 4; i++) ref_agent_bary(ref_agents, i, id) = bary[i];
      return REF_SUCCESS;
    }

    if (ref_grid_twod(ref_grid)) {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] < bary[0] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] < bary[0] && bary[2] < bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] <= bary[0] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] <= bary[0] && bary[2] <= bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
    } else {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }

      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }
    }
    THROW("unable to find the next step");
  }

  /* steps reached limit */
  ref_agent_mode(ref_agents, id) = REF_AGENT_TERMINATED;

  return REF_SUCCESS;
}